

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

int av1_skip_u4x4_pred_in_obmc(BLOCK_SIZE bsize,macroblockd_plane *pd,int dir)

{
  undefined3 in_register_00000039;
  
  return (int)(dir == 0 &&
              av1_ss_size_lookup[CONCAT31(in_register_00000039,bsize)][pd->subsampling_x]
              [pd->subsampling_y] < BLOCK_8X8);
}

Assistant:

int av1_skip_u4x4_pred_in_obmc(BLOCK_SIZE bsize,
                               const struct macroblockd_plane *pd, int dir) {
  assert(is_motion_variation_allowed_bsize(bsize));

  const BLOCK_SIZE bsize_plane =
      get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
  switch (bsize_plane) {
#if DISABLE_CHROMA_U8X8_OBMC
    case BLOCK_4X4:
    case BLOCK_8X4:
    case BLOCK_4X8: return 1;
#else
    case BLOCK_4X4:
    case BLOCK_8X4:
    case BLOCK_4X8: return dir == 0;
#endif
    default: return 0;
  }
}